

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O2

void __thiscall
Clone_modelWithVariableEquivalences_Test::~Clone_modelWithVariableEquivalences_Test
          (Clone_modelWithVariableEquivalences_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Clone, modelWithVariableEquivalences)
{
    auto m = libcellml::Model::create();
    m->setId("unique_model");
    m->setName("model");

    auto c = libcellml::Component::create();
    auto c1 = libcellml::Component::create();
    auto c2 = libcellml::Component::create();
    auto v1 = libcellml::Variable::create();
    auto v2 = libcellml::Variable::create();
    auto u = libcellml::Units::create();

    u->setName("second");

    v1->setUnits(u);
    v2->setUnits(u);
    m->addUnits(u);

    c->setId("unique");
    c->setName("copy");
    c1->setName("child_1");
    c1->addVariable(v1);
    c2->setName("child_2");
    c2->addVariable(v2);

    c->addComponent(c1);
    c->addComponent(c2);

    m->addComponent(c);

    libcellml::Variable::addEquivalence(v1, v2);

    auto mClone = m->clone();

    compareModel(m, mClone);

    libcellml::PrinterPtr p = libcellml::Printer::create();

    EXPECT_EQ(p->printModel(m), p->printModel(mClone));
}